

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O3

Fad<double> * __thiscall
Fad<double>::operator+=(Fad<double> *this,FadExpr<FadBinaryDiv<Fad<double>,_Fad<double>_>_> *x)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  Fad<double> *pFVar8;
  Fad<double> *pFVar9;
  double *pdVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  double *pdVar14;
  long lVar15;
  double *pdVar16;
  double *pdVar17;
  double *pdVar18;
  
  pFVar8 = (x->fadexpr_).left_;
  pFVar9 = (x->fadexpr_).right_;
  uVar3 = (pFVar8->dx_).num_elts;
  uVar4 = (pFVar9->dx_).num_elts;
  uVar11 = uVar4;
  if ((int)uVar4 < (int)uVar3) {
    uVar11 = uVar3;
  }
  if (uVar11 != 0) {
    uVar5 = (this->dx_).num_elts;
    uVar12 = (ulong)uVar5;
    if (uVar12 == 0) {
      (this->dx_).num_elts = uVar11;
      uVar13 = (ulong)uVar11;
      uVar12 = 0xffffffffffffffff;
      if (-1 < (int)uVar11) {
        uVar12 = uVar13 * 8;
      }
      pdVar10 = (double *)operator_new__(uVar12);
      (this->dx_).ptr_to_data = pdVar10;
      iVar6 = (pFVar8->dx_).num_elts;
      if ((iVar6 == 0) || ((pFVar9->dx_).num_elts == 0)) {
        if (0 < (int)uVar11) {
          iVar7 = (pFVar9->dx_).num_elts;
          pdVar14 = (pFVar8->dx_).ptr_to_data;
          dVar1 = pFVar9->val_;
          pdVar16 = (pFVar9->dx_).ptr_to_data;
          dVar2 = pFVar8->val_;
          uVar12 = 0;
          do {
            pdVar17 = pdVar14;
            if (iVar6 == 0) {
              pdVar17 = &pFVar8->defaultVal;
            }
            pdVar18 = pdVar16;
            if (iVar7 == 0) {
              pdVar18 = &pFVar9->defaultVal;
            }
            pdVar10[uVar12] = (*pdVar17 * dVar1 - *pdVar18 * dVar2) / (dVar1 * dVar1);
            uVar12 = uVar12 + 1;
            pdVar16 = pdVar16 + 1;
            pdVar14 = pdVar14 + 1;
          } while (uVar13 != uVar12);
        }
      }
      else if (0 < (int)uVar11) {
        pdVar14 = (pFVar8->dx_).ptr_to_data;
        pdVar16 = (pFVar9->dx_).ptr_to_data;
        dVar1 = pFVar9->val_;
        dVar2 = pFVar8->val_;
        uVar12 = 0;
        do {
          pdVar10[uVar12] = (pdVar14[uVar12] * dVar1 - pdVar16[uVar12] * dVar2) / (dVar1 * dVar1);
          uVar12 = uVar12 + 1;
        } while (uVar13 != uVar12);
      }
    }
    else {
      pdVar10 = (this->dx_).ptr_to_data;
      if (uVar3 == 0 || uVar4 == 0) {
        if (0 < (int)uVar5) {
          lVar15 = 0;
          do {
            pdVar14 = (double *)((long)(pFVar8->dx_).ptr_to_data + lVar15);
            if (uVar3 == 0) {
              pdVar14 = &pFVar8->defaultVal;
            }
            pdVar16 = (double *)((long)(pFVar9->dx_).ptr_to_data + lVar15);
            if (uVar4 == 0) {
              pdVar16 = &pFVar9->defaultVal;
            }
            dVar1 = pFVar9->val_;
            *(double *)((long)pdVar10 + lVar15) =
                 (*pdVar14 * dVar1 - pFVar8->val_ * *pdVar16) / (dVar1 * dVar1) +
                 *(double *)((long)pdVar10 + lVar15);
            lVar15 = lVar15 + 8;
          } while (uVar12 << 3 != lVar15);
        }
      }
      else if (0 < (int)uVar5) {
        pdVar14 = (pFVar8->dx_).ptr_to_data;
        pdVar16 = (pFVar9->dx_).ptr_to_data;
        uVar13 = 0;
        do {
          dVar1 = pFVar9->val_;
          pdVar10[uVar13] =
               (pdVar14[uVar13] * dVar1 - pFVar8->val_ * pdVar16[uVar13]) / (dVar1 * dVar1) +
               pdVar10[uVar13];
          uVar13 = uVar13 + 1;
        } while (uVar12 != uVar13);
      }
    }
  }
  this->val_ = pFVar8->val_ / pFVar9->val_ + this->val_;
  return this;
}

Assistant:

inline  Fad<T> & Fad<T>::operator+= (const FadExpr<ExprT>& x)
{
  int xsz = x.size(), sz = dx_.size();

  if (xsz) {
    if (sz) {
      T* RESTRICT dxp = dx_.begin();
      if (x.hasFastAccess())
	for (int i=0; i<sz; ++i)
	  dxp[i] += x.fastAccessDx(i);
      else
	for (int i=0; i<sz; ++i)
	  dxp[i] += x.dx(i);
    }
    else {
      dx_.resize(xsz);
      T* RESTRICT dxp = dx_.begin();
      if (x.hasFastAccess())
	for (int i=0; i<xsz; ++i)
	  dxp[i] = x.fastAccessDx(i);
      else
	for (int i=0; i<xsz; ++i)
	  dxp[i] = x.dx(i);
    }
  }

  val_ += x.val();

  return *this;
}